

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O1

IHEVCD_ERROR_T ihevcd_parse_pic_timing_sei(codec_t *ps_codec,sps_t *ps_sps)

{
  bitstrm_t *ps_bitstrm;
  UWORD32 UVar1;
  uint uVar2;
  
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  (ps_codec->s_parse).s_sei_params.i1_pic_timing_params_present_flag = '\x01';
  if ((ps_sps->s_vui_parameters).u1_frame_field_info_present_flag != '\0') {
    UVar1 = ihevcd_bits_get(ps_bitstrm,4);
    (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.u4_pic_struct = UVar1;
    UVar1 = ihevcd_bits_get(ps_bitstrm,2);
    (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.u4_source_scan_type = UVar1;
    UVar1 = ihevcd_bits_get(ps_bitstrm,1);
    (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.u1_duplicate_flag = (UWORD8)UVar1;
  }
  if (((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_nal_hrd_parameters_present_flag != '\0')
     || ((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_vcl_hrd_parameters_present_flag != '\0')
     ) {
    UVar1 = ihevcd_bits_get(ps_bitstrm,
                            (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                            u1_au_cpb_removal_delay_length_minus1 + 1);
    (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.u4_au_cpb_removal_delay_minus1 = UVar1;
    UVar1 = ihevcd_bits_get(ps_bitstrm,
                            (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                            u1_dpb_output_delay_length_minus1 + 1);
    (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.u4_pic_dpb_output_delay = UVar1;
    if ((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_sub_pic_cpb_params_present_flag != '\0')
    {
      UVar1 = ihevcd_bits_get(ps_bitstrm,
                              (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                              u1_dpb_output_delay_du_length_minus1 + 1);
      (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.u4_pic_dpb_output_du_delay = UVar1;
    }
    if (((ps_sps->s_vui_parameters).s_vui_hrd_parameters.u1_sub_pic_cpb_params_present_flag != '\0')
       && ((ps_sps->s_vui_parameters).s_vui_hrd_parameters.
           u1_sub_pic_cpb_params_in_pic_timing_sei_flag != '\0')) {
      UVar1 = ihevcd_uev(ps_bitstrm);
      (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.u4_num_decoding_units_minus1 = UVar1;
      UVar1 = ihevcd_bits_get(ps_bitstrm,1);
      (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.u1_du_common_cpb_removal_delay_flag =
           (UWORD8)UVar1;
      if ((UWORD8)UVar1 != '\0') {
        UVar1 = ihevcd_bits_get(ps_bitstrm,
                                (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                                u1_du_cpb_removal_delay_increment_length_minus1 + 1);
        (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.
        u4_du_common_cpb_removal_delay_increment_minus1 = UVar1;
      }
      uVar2 = 0;
      do {
        UVar1 = ihevcd_uev(ps_bitstrm);
        (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.au4_num_nalus_in_du_minus1[uVar2] =
             UVar1;
        if (((ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.
             u1_du_common_cpb_removal_delay_flag == '\0') &&
           (uVar2 < (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.
                    u4_num_decoding_units_minus1)) {
          UVar1 = ihevcd_bits_get(ps_bitstrm,
                                  (ps_sps->s_vui_parameters).s_vui_hrd_parameters.
                                  u1_du_cpb_removal_delay_increment_length_minus1 + 1);
          (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.
          au4_du_cpb_removal_delay_increment_minus1[uVar2] = UVar1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 <= (ps_codec->s_parse).s_sei_params.s_pic_timing_sei_params.
                        u4_num_decoding_units_minus1);
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_pic_timing_sei(codec_t *ps_codec, sps_t *ps_sps)
{
    parse_ctxt_t *ps_parse = &ps_codec->s_parse;
    bitstrm_t *ps_bitstrm = &ps_parse->s_bitstrm;
    UWORD32 value;
    vui_t *ps_vui;
    UWORD32 i;
    hrd_params_t *ps_vui_hdr;
    UWORD32 u4_cpb_dpb_delays_present_flag = 0;
    pic_timing_sei_params_t *ps_pic_timing;

    ps_pic_timing = &ps_parse->s_sei_params.s_pic_timing_sei_params;
    ps_vui = &ps_sps->s_vui_parameters;
    ps_vui_hdr = &ps_vui->s_vui_hrd_parameters;
    ps_parse->s_sei_params.i1_pic_timing_params_present_flag = 1;
    if(ps_vui->u1_frame_field_info_present_flag)
    {
        BITS_PARSE("pic_struct", value, ps_bitstrm, 4);
        ps_pic_timing->u4_pic_struct = value;

        BITS_PARSE("source_scan_type", value, ps_bitstrm, 2);
        ps_pic_timing->u4_source_scan_type = value;

        BITS_PARSE("duplicate_flag", value, ps_bitstrm, 1);
        ps_pic_timing->u1_duplicate_flag = value;
    }

    if(ps_vui_hdr->u1_nal_hrd_parameters_present_flag
                    || ps_vui_hdr->u1_vcl_hrd_parameters_present_flag)
    {
        u4_cpb_dpb_delays_present_flag = 1;
    }
    else
    {
        u4_cpb_dpb_delays_present_flag = 0;
    }

    if(u4_cpb_dpb_delays_present_flag)
    {
        BITS_PARSE("au_cpb_removal_delay_minus1", value, ps_bitstrm,
                   (ps_vui_hdr->u1_au_cpb_removal_delay_length_minus1 + 1));
        ps_pic_timing->u4_au_cpb_removal_delay_minus1 = value;

        BITS_PARSE("pic_dpb_output_delay", value, ps_bitstrm,
                   (ps_vui_hdr->u1_dpb_output_delay_length_minus1 + 1));
        ps_pic_timing->u4_pic_dpb_output_delay = value;

        if(ps_vui_hdr->u1_sub_pic_cpb_params_present_flag)
        {
            BITS_PARSE("pic_dpb_output_du_delay", value, ps_bitstrm,
                       (ps_vui_hdr->u1_dpb_output_delay_du_length_minus1 + 1));
            ps_pic_timing->u4_pic_dpb_output_du_delay = value;
        }

        if(ps_vui_hdr->u1_sub_pic_cpb_params_present_flag
                        && ps_vui_hdr->u1_sub_pic_cpb_params_in_pic_timing_sei_flag)
        {
            UEV_PARSE("num_decoding_units_minus1", value, ps_bitstrm);
            ps_pic_timing->u4_num_decoding_units_minus1 = value;

            BITS_PARSE("du_common_cpb_removal_delay_flag", value, ps_bitstrm, 1);
            ps_pic_timing->u1_du_common_cpb_removal_delay_flag = value;

            if(ps_pic_timing->u1_du_common_cpb_removal_delay_flag)
            {
                BITS_PARSE("du_common_cpb_removal_delay_increment_minus1",
                           value,
                           ps_bitstrm,
                           (ps_vui_hdr->u1_du_cpb_removal_delay_increment_length_minus1
                                           + 1));
                ps_pic_timing->u4_du_common_cpb_removal_delay_increment_minus1 =
                                value;
            }

            for(i = 0; i <= ps_pic_timing->u4_num_decoding_units_minus1; i++)
            {
                UEV_PARSE("num_nalus_in_du_minus1", value, ps_bitstrm);
                ps_pic_timing->au4_num_nalus_in_du_minus1[i] = value;

                if((!ps_pic_timing->u1_du_common_cpb_removal_delay_flag)
                                && (i < ps_pic_timing->u4_num_decoding_units_minus1))
                {
                    BITS_PARSE("du_common_cpb_removal_delay_increment_minus1",
                               value,
                               ps_bitstrm,
                               (ps_vui_hdr->u1_du_cpb_removal_delay_increment_length_minus1
                                               + 1));
                    ps_pic_timing->au4_du_cpb_removal_delay_increment_minus1[i] =
                                    value;
                }
            }
        }
    }

    return (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
}